

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

Instruction * __thiscall spvtools::opt::Instruction::Clone(Instruction *this,IRContext *c)

{
  pointer pIVar1;
  bool bVar2;
  uint32_t uVar3;
  Instruction *this_00;
  Instruction *i;
  pointer this_01;
  
  this_00 = (Instruction *)operator_new(0x70);
  Instruction(this_00,c);
  this_00->opcode_ = this->opcode_;
  this_00->has_type_id_ = this->has_type_id_;
  this_00->has_result_id_ = this->has_result_id_;
  uVar3 = IRContext::TakeNextUniqueId(c);
  this_00->unique_id_ = uVar3;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::operator=
            (&this_00->operands_,&this->operands_);
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::operator=
            (&this_00->dbg_line_insts_,&this->dbg_line_insts_);
  pIVar1 = (this_00->dbg_line_insts_).
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this_00->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != pIVar1; this_01 = this_01 + 1
      ) {
    uVar3 = IRContext::TakeNextUniqueId(c);
    this_01->unique_id_ = uVar3;
    bVar2 = IsDebugLineInst(this_01);
    if (bVar2) {
      uVar3 = IRContext::TakeNextId(c);
      SetResultId(this_01,uVar3);
    }
  }
  this_00->dbg_scope_ = this->dbg_scope_;
  return this_00;
}

Assistant:

Instruction* Instruction::Clone(IRContext* c) const {
  Instruction* clone = new Instruction(c);
  clone->opcode_ = opcode_;
  clone->has_type_id_ = has_type_id_;
  clone->has_result_id_ = has_result_id_;
  clone->unique_id_ = c->TakeNextUniqueId();
  clone->operands_ = operands_;
  clone->dbg_line_insts_ = dbg_line_insts_;
  for (auto& i : clone->dbg_line_insts_) {
    i.unique_id_ = c->TakeNextUniqueId();
    if (i.IsDebugLineInst()) i.SetResultId(c->TakeNextId());
  }
  clone->dbg_scope_ = dbg_scope_;
  return clone;
}